

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O2

void __thiscall NPC_Data::NPC_Data(NPC_Data *this,World *world,short id)

{
  this->id = id;
  (this->drops).
  super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->drops).
  super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->drops).
  super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->drops_chance_total = 0.0;
  (this->shop_name)._M_dataplus._M_p = (pointer)&(this->shop_name).field_2;
  (this->shop_name)._M_string_length = 0;
  (this->shop_name).field_2._M_local_buf[0] = '\0';
  (this->skill_name)._M_dataplus._M_p = (pointer)&(this->skill_name).field_2;
  (this->skill_name)._M_string_length = 0;
  (this->skill_name).field_2._M_local_buf[0] = '\0';
  (this->shop_trade).
  super__Vector_base<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shop_trade).
  super__Vector_base<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shop_trade).
  super__Vector_base<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shop_craft).
  super__Vector_base<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shop_craft).
  super__Vector_base<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shop_craft).
  super__Vector_base<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->skill_learn).
  super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->skill_learn).
  super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skill_learn).
  super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->citizenship)._M_t.
  super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>._M_t.
  super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>.
  super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl = (NPC_Citizenship *)0x0;
  this->world = world;
  LoadShopDrop(this);
  return;
}

Assistant:

NPC_Data::NPC_Data(World* world, short id)
	: id(id)
	, drops_chance_total(0.0)
	, world(world)
{
	this->LoadShopDrop();
}